

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_buffered_stream.c
# Opt level: O2

void save_to_check_buffer
               (cio_buffered_stream *bs,void *context,cio_error err,cio_read_buffer *buffer,
               size_t num_bytes)

{
  size_t sVar1;
  
  sVar1 = first_check_buffer_pos;
  if (err != CIO_SUCCESS) {
    return;
  }
  memcpy(first_check_buffer + first_check_buffer_pos,buffer->fetch_ptr,num_bytes);
  buffer->fetch_ptr = buffer->fetch_ptr + num_bytes;
  first_check_buffer_pos = sVar1 + num_bytes;
  return;
}

Assistant:

static void save_to_check_buffer(struct cio_buffered_stream *bs, void *context, enum cio_error err, struct cio_read_buffer *buffer, size_t num_bytes)
{
	(void)bs;
	(void)context;

	if (err == CIO_SUCCESS) {
		uint8_t *read_ptr = cio_read_buffer_get_read_ptr(buffer);
		memcpy(&first_check_buffer[first_check_buffer_pos], read_ptr, num_bytes);
		cio_read_buffer_consume(buffer, num_bytes);
		first_check_buffer_pos += num_bytes;
	}
}